

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_to_bytes(uchar *buf,secp256k1_ge *a)

{
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_50;
  
  secp256k1_ge_to_storage(&local_50,a);
  *(uint64_t *)(buf + 0x30) = local_50.y.n[2];
  *(uint64_t *)(buf + 0x38) = local_50.y.n[3];
  *(uint64_t *)(buf + 0x20) = local_50.y.n[0];
  *(uint64_t *)(buf + 0x28) = local_50.y.n[1];
  *(uint64_t *)(buf + 0x10) = local_50.x.n[2];
  *(uint64_t *)(buf + 0x18) = local_50.x.n[3];
  *(uint64_t *)buf = local_50.x.n[0];
  *(uint64_t *)(buf + 8) = local_50.x.n[1];
  return;
}

Assistant:

static void secp256k1_ge_to_bytes(unsigned char *buf, const secp256k1_ge *a) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(a));
    secp256k1_ge_to_storage(&s, a);
    memcpy(buf, &s, 64);
}